

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

QString * formatLogMessage(QString *__return_storage_ptr__,QtMsgType type,
                          QMessageLogContext *context,QString *str)

{
  char *pcVar1;
  BacktraceParams *pBVar2;
  QString *pQVar3;
  undefined1 auVar4 [16];
  QByteArray info;
  long lVar5;
  QBasicMutex QVar6;
  bool bVar7;
  int iVar8;
  Type *pTVar9;
  char **ppcVar10;
  qint64 n;
  pthread_t __target_thread;
  QThread *n_00;
  undefined8 extraout_RAX;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  byte bVar14;
  long lVar15;
  qsizetype objectSize;
  QBasicMutex *pQVar16;
  QArrayData *data;
  int iVar17;
  long lVar18;
  long in_FS_OFFSET;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QUtf8StringView str_03;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QString *pQVar24;
  undefined7 in_stack_ffffffffffffff10;
  int iVar25;
  QDateTime local_b0;
  QByteArray local_a8;
  QString local_90;
  BacktraceParams local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar24 = __return_storage_ptr__;
  if ((AtomicType)QMessagePattern::mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    pQVar16 = &QMessagePattern::mutex;
    QBasicMutex::lockInternal(&QMessagePattern::mutex);
    __return_storage_ptr__ = (QString *)pQVar16;
  }
  pTVar9 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                       *)__return_storage_ptr__);
  if (pTVar9 == (Type *)0x0) {
    QString::append(pQVar24,str);
LAB_00213ac1:
    QVar6.d_ptr._q_value._M_b._M_p = QMessagePattern::mutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar6.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex
                (&QMessagePattern::mutex,(void *)QVar6.d_ptr._q_value._M_b._M_p);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar24;
    }
  }
  else {
    ppcVar10 = (pTVar9->tokens)._M_t.
               super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    if (ppcVar10 != (char **)0x0) {
      bVar19 = type != QtFatalMsg;
      bVar20 = type != QtCriticalMsg;
      bVar21 = type != QtWarningMsg;
      bVar22 = type != QtInfoMsg;
      bVar23 = type != QtDebugMsg;
      pcVar1 = (char *)((ulong)type * 4);
      lVar18 = 0;
      iVar25 = 0;
      iVar17 = 0;
      pcVar11 = pcVar1;
      bVar13 = 0;
      do {
        pcVar12 = ppcVar10[lVar18];
        if (pcVar12 == (char *)0x0) goto LAB_00213ac1;
        if (pcVar12 == "%{endif}") {
          bVar14 = 0;
          goto LAB_00213a92;
        }
        bVar14 = bVar13;
        if ((bVar13 & 1) == 0) {
          if (pcVar12 == "%{message}") {
            QString::append(pQVar24,str);
          }
          else if (pcVar12 == "%{category}") {
            pcVar12 = context->category;
            if (pcVar12 == (char *)0x0) {
              lVar15 = 0;
            }
            else {
              lVar15 = -1;
              do {
                lVar5 = lVar15 + 1;
                lVar15 = lVar15 + 1;
              } while (pcVar12[lVar5] != '\0');
            }
LAB_002133f1:
            str_00.m_data = pcVar12;
            str_00.m_size = lVar15;
            QString::append(pQVar24,str_00);
            bVar14 = bVar13;
          }
          else if (pcVar12 == "%{type}") {
            if (type < (QtInfoMsg|QtWarningMsg)) {
              lVar15 = *(long *)(&DAT_004d8928 + (ulong)type * 8);
              pcVar11 = "\x113";
              pcVar12 = &DAT_004d8950 + *(int *)(pcVar1 + 0x4d8950);
              goto LAB_00213504;
            }
          }
          else if (pcVar12 == "%{file}") {
            pcVar12 = context->file;
            if (pcVar12 == (char *)0x0) {
LAB_002134f8:
              lVar15 = 7;
              pcVar12 = "unknown";
            }
            else {
              lVar15 = -1;
              do {
                lVar5 = lVar15 + 1;
                lVar15 = lVar15 + 1;
              } while (pcVar12[lVar5] != '\0');
            }
LAB_00213504:
            str_01.m_data = pcVar12;
            str_01.m_size = lVar15;
            QString::append(pQVar24,str_01);
          }
          else {
            if (pcVar12 == "%{line}") {
              QString::number(&local_58,context->line,10);
              QString::append(pQVar24,&local_58);
              goto LAB_00213635;
            }
            if (pcVar12 == "%{function}") {
              if (context->function == (char *)0x0) goto LAB_002134f8;
              QByteArray::QByteArray(&local_a8,context->function,-1);
              info.d.ptr._0_7_ = in_stack_ffffffffffffff10;
              info.d.d = (Data *)pQVar24;
              info.d.ptr._7_1_ = bVar19;
              info.d.size._0_1_ = bVar20;
              info.d.size._1_1_ = bVar21;
              info.d.size._2_1_ = bVar22;
              info.d.size._3_1_ = bVar23;
              info.d.size._4_4_ = iVar25;
              qCleanupFuncinfo((QByteArray *)&local_90,info);
              ba.m_data = pcVar11;
              ba.m_size = (qsizetype)local_90.d.ptr;
              QString::fromLatin1(&local_58,(QString *)local_90.d.size,ba);
              QString::append(pQVar24,&local_58);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00213a92;
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i !=
                  0) goto LAB_00213a92;
              objectSize = 1;
              data = &(local_a8.d.d)->super_QArrayData;
            }
            else {
              if (pcVar12 == "%{pid}") {
                n = QCoreApplication::applicationPid();
                QString::number(&local_58,n,10);
                QString::append(pQVar24,&local_58);
LAB_00213635:
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  data = &(local_58.d.d)->super_QArrayData;
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) goto LAB_00213657;
                }
                goto LAB_00213a92;
              }
              if (pcVar12 == "%{appname}") {
                QCoreApplication::applicationName();
                QString::append(pQVar24,&local_58);
                goto LAB_00213635;
              }
              if (pcVar12 == "%{threadid}") {
                lVar15 = syscall(0xba);
                QString::number(&local_58,lVar15,10);
                QString::append(pQVar24,&local_58);
                goto LAB_00213635;
              }
              if (pcVar12 == "%{threadname}") {
                local_58.d.d = (Data *)0x0;
                local_58.d.ptr = (char16_t *)0x0;
                __target_thread = pthread_self();
                iVar8 = pthread_getname_np(__target_thread,(char *)&local_58,0x10);
                if (iVar8 == 0) {
                  lVar15 = -1;
                  do {
                    lVar5 = lVar15 + 1;
                    lVar15 = lVar15 + 1;
                  } while (*(char *)((long)&local_58.d.d + lVar5) != '\0');
                  if (lVar15 != 0) {
                    str_03.m_size = lVar15;
                    str_03.m_data = (storage_type *)&local_58;
                    QString::append(pQVar24,str_03);
                    goto LAB_00213a92;
                  }
                }
                lVar15 = syscall(0xba);
                QString::number(&local_58,lVar15,10);
                QString::append(pQVar24,&local_58);
                goto LAB_00213635;
              }
              if (pcVar12 == "%{qthreadptr}") {
                str_02.m_data = "0x";
                str_02.m_size = 2;
                QString::append(pQVar24,str_02);
                QThread::currentThread();
                n_00 = QThread::currentThread();
                QString::number(&local_58,(qlonglong)n_00,0x10);
                QString::append(pQVar24,&local_58);
                goto LAB_00213635;
              }
              if (pcVar12 != "%{backtrace") {
                if (pcVar12 != "%{time") {
                  if (pcVar12 == "%{if-category}") {
                    if (context->category == (char *)0x0) {
                      bVar14 = 1;
                    }
                    else {
                      iVar8 = strcmp(context->category,"default");
                      if (iVar8 == 0) {
                        bVar14 = 1;
                      }
                    }
                  }
                  else {
                    bVar14 = bVar23;
                    if ((((pcVar12 != "%{if-debug}") && (bVar14 = bVar22, pcVar12 != "%{if-info}"))
                        && (bVar14 = bVar21, pcVar12 != "%{if-warning}")) &&
                       ((bVar14 = bVar20, pcVar12 != "%{if-critical}" &&
                        (bVar14 = bVar19, pcVar12 != "%{if-fatal}")))) {
                      lVar15 = -1;
                      do {
                        lVar5 = lVar15 + 1;
                        lVar15 = lVar15 + 1;
                      } while (pcVar12[lVar5] != '\0');
                      goto LAB_002133f1;
                    }
                  }
                  goto LAB_00213a92;
                }
                pQVar3 = (pTVar9->timeArgs).d.ptr;
                local_58.d.d = pQVar3[iVar25].d.d;
                local_58.d.ptr = pQVar3[iVar25].d.ptr;
                pcVar11 = (char *)pQVar3[iVar25].d.size;
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                  super___atomic_base<int>._M_i =
                       (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                       super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                local_58.d.size = (qsizetype)pcVar11;
                if (pcVar11 == (char *)0x0) {
                  QDateTime::currentDateTime();
                  QDateTime::toString(&local_90,&local_b0,ISODate);
                  QString::append(pQVar24,&local_90);
LAB_00213a38:
                  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QDateTime::~QDateTime(&local_b0);
                }
                else {
                  if (pcVar11 != (char *)0x4) {
                    if (pcVar11 == &DAT_00000007) {
                      rhs.m_data = "process";
                      rhs.m_size = 7;
                      pcVar11 = "process";
                      lhs.m_data = local_58.d.ptr;
                      lhs.m_size = 7;
                      bVar7 = QtPrivate::equalStrings(lhs,rhs);
                      if (bVar7) {
                        lVar15 = std::chrono::_V2::steady_clock::now();
                        lVar15 = lVar15 - (pTVar9->appStartTime).__d.__r;
                        auVar4 = SEXT816(lVar15) * SEXT816(0x431bde82d7b634db);
                        pcVar11 = (char *)(ulong)(uint)((int)(lVar15 / 1000000000) * -1000 +
                                                       ((int)(auVar4._8_8_ >> 0x12) -
                                                       (auVar4._12_4_ >> 0x1f)));
                        QString::asprintf((char **)&local_90,"%6lld.%03u");
                        QString::append(pQVar24,&local_90);
                        goto LAB_002139a4;
                      }
                    }
LAB_002139d9:
                    QDateTime::currentDateTime();
                    QDateTime::toString(&local_90,&local_b0,&local_58);
                    QString::append(pQVar24,&local_90);
                    goto LAB_00213a38;
                  }
                  rhs_00.m_data = "boot";
                  rhs_00.m_size = 4;
                  pcVar11 = "boot";
                  lhs_00.m_data = local_58.d.ptr;
                  lhs_00.m_size = 4;
                  bVar7 = QtPrivate::equalStrings(lhs_00,rhs_00);
                  if (!bVar7) goto LAB_002139d9;
                  lVar15 = std::chrono::_V2::steady_clock::now();
                  pcVar11 = (char *)(ulong)(uint)((int)(lVar15 / 1000000000) * -1000 +
                                                 ((int)(SUB168(SEXT816(lVar15) *
                                                               SEXT816(0x431bde82d7b634db),8) >>
                                                       0x12) -
                                                 (SUB164(SEXT816(lVar15) *
                                                         SEXT816(0x431bde82d7b634db),0xc) >> 0x1f)))
                  ;
                  QString::asprintf((char **)&local_90,"%6lld.%03u");
                  QString::append(pQVar24,&local_90);
LAB_002139a4:
                  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                goto LAB_00213a8e;
              }
              lVar15 = (long)iVar17;
              pBVar2 = (pTVar9->backtraceArgs).d.ptr;
              pcVar11 = (char *)(lVar15 * 0x20);
              data = &(pBVar2[lVar15].backtraceSeparator.d.d)->super_QArrayData;
              local_78.backtraceSeparator.d.ptr = pBVar2[lVar15].backtraceSeparator.d.ptr;
              local_78.backtraceSeparator.d.size = pBVar2[lVar15].backtraceSeparator.d.size;
              if (data != (QArrayData *)0x0) {
                LOCK();
                (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                     (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_78.backtraceDepth = pBVar2[lVar15].backtraceDepth;
              if (data != (QArrayData *)0x0) {
                LOCK();
                (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                     (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_78.backtraceSeparator.d.d = (Data *)data;
              formatBacktraceForLogMessage(&local_58,&local_78,context);
              QString::append(pQVar24,&local_58);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_78.backtraceSeparator.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_78.backtraceSeparator.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_78.backtraceSeparator.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar17 = iVar17 + 1;
              if (data == (QArrayData *)0x0) goto LAB_00213a92;
              LOCK();
              (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QArrayData *)&data->ref_)->ref_)._q_value.super___atomic_base<int>._M_i != 0)
              goto LAB_00213a92;
LAB_00213657:
              objectSize = 2;
            }
            QArrayData::deallocate(data,objectSize,0x10);
          }
        }
        else {
          if (pcVar12 != "%{time") {
            pcVar11 = "%{backtrace";
            iVar17 = iVar17 + (uint)(pcVar12 == "%{backtrace");
            goto LAB_00213a92;
          }
LAB_00213a8e:
          iVar25 = iVar25 + 1;
        }
LAB_00213a92:
        lVar18 = lVar18 + 1;
        ppcVar10 = (pTVar9->tokens)._M_t.
                   super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
        bVar13 = bVar14;
      } while (ppcVar10 != (char **)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      formatLogMessage();
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVar6.d_ptr._q_value._M_b._M_p = QMessagePattern::mutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QMessagePattern::mutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
      UNLOCK();
      if ((AtomicType)QVar6.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
        QBasicMutex::unlockInternalFutex
                  (&QMessagePattern::mutex,(void *)QVar6.d_ptr._q_value._M_b._M_p);
      }
      QString::~QString(pQVar24);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(extraout_RAX);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString formatLogMessage(QtMsgType type, const QMessageLogContext &context, const QString &str)
{
    QString message;

    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    QMessagePattern *pattern = qMessagePattern();
    if (!pattern) {
        // after destruction of static QMessagePattern instance
        message.append(str);
        return message;
    }

    bool skip = false;

    int timeArgsIdx = 0;
#ifdef QLOGGING_HAVE_BACKTRACE
    int backtraceArgsIdx = 0;
#endif

    // we do not convert file, function, line literals to local encoding due to overhead
    for (int i = 0; pattern->tokens[i]; ++i) {
        const char *token = pattern->tokens[i];
        if (token == endifTokenC) {
            skip = false;
        } else if (skip) {
            // we skip adding messages, but we have to iterate over
            // timeArgsIdx and backtraceArgsIdx anyway
            if (token == timeTokenC)
                timeArgsIdx++;
#ifdef QLOGGING_HAVE_BACKTRACE
            else if (token == backtraceTokenC)
                backtraceArgsIdx++;
#endif
        } else if (token == messageTokenC) {
            message.append(str);
        } else if (token == categoryTokenC) {
            message.append(QLatin1StringView(context.category));
        } else if (token == typeTokenC) {
            switch (type) {
            case QtDebugMsg:   message.append("debug"_L1); break;
            case QtInfoMsg:    message.append("info"_L1); break;
            case QtWarningMsg: message.append("warning"_L1); break;
            case QtCriticalMsg:message.append("critical"_L1); break;
            case QtFatalMsg:   message.append("fatal"_L1); break;
            }
        } else if (token == fileTokenC) {
            if (context.file)
                message.append(QLatin1StringView(context.file));
            else
                message.append("unknown"_L1);
        } else if (token == lineTokenC) {
            message.append(QString::number(context.line));
        } else if (token == functionTokenC) {
            if (context.function)
                message.append(QString::fromLatin1(qCleanupFuncinfo(context.function)));
            else
                message.append("unknown"_L1);
        } else if (token == pidTokenC) {
            message.append(QString::number(QCoreApplication::applicationPid()));
        } else if (token == appnameTokenC) {
            message.append(QCoreApplication::applicationName());
        } else if (token == threadidTokenC) {
            // print the TID as decimal
            message.append(QString::number(qt_gettid()));
        } else if (token == threadnameTokenC) {
            if (!qt_append_thread_name_to(message))
                message.append(QString::number(qt_gettid())); // fallback to the TID
        } else if (token == qthreadptrTokenC) {
            message.append("0x"_L1);
            message.append(QString::number(qlonglong(QThread::currentThread()->currentThread()), 16));
#ifdef QLOGGING_HAVE_BACKTRACE
        } else if (token == backtraceTokenC) {
            QMessagePattern::BacktraceParams backtraceParams = pattern->backtraceArgs.at(backtraceArgsIdx);
            backtraceArgsIdx++;
            message.append(formatBacktraceForLogMessage(backtraceParams, context));
#endif
        } else if (token == timeTokenC) {
            using namespace std::chrono;
            auto formatElapsedTime = [](steady_clock::duration time) {
                // we assume time > 0
                auto ms = duration_cast<milliseconds>(time);
                auto sec = duration_cast<seconds>(ms);
                ms -= sec;
                return QString::asprintf("%6lld.%03u", qint64(sec.count()), uint(ms.count()));
            };
            QString timeFormat = pattern->timeArgs.at(timeArgsIdx);
            timeArgsIdx++;
            if (timeFormat == "process"_L1) {
                message += formatElapsedTime(steady_clock::now() - pattern->appStartTime);
            } else if (timeFormat == "boot"_L1) {
                // just print the milliseconds since the elapsed timer reference
                // like the Linux kernel does
                message += formatElapsedTime(steady_clock::now().time_since_epoch());
#if QT_CONFIG(datestring)
            } else if (timeFormat.isEmpty()) {
                message.append(QDateTime::currentDateTime().toString(Qt::ISODate));
            } else {
                message.append(QDateTime::currentDateTime().toString(timeFormat));
#endif // QT_CONFIG(datestring)
            }
        } else if (token == ifCategoryTokenC) {
            if (isDefaultCategory(context.category))
                skip = true;
#define HANDLE_IF_TOKEN(LEVEL)  \
        } else if (token == if##LEVEL##TokenC) { \
            skip = type != Qt##LEVEL##Msg;
        HANDLE_IF_TOKEN(Debug)
        HANDLE_IF_TOKEN(Info)
        HANDLE_IF_TOKEN(Warning)
        HANDLE_IF_TOKEN(Critical)
        HANDLE_IF_TOKEN(Fatal)
#undef HANDLE_IF_TOKEN
        } else {
            message.append(QLatin1StringView(token));
        }
    }
    return message;
}